

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

PipelineStage
vkt::memory::anon_unknown_0::pipelineStageFlagToPipelineStage(VkPipelineStageFlagBits flags)

{
  if ((int)flags < 0x100) {
    if ((int)flags < 0x10) {
      switch(flags) {
      case VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT:
        return PIPELINESTAGE_TOP_OF_PIPE_BIT;
      case VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT:
        return PIPELINESTAGE_DRAW_INDIRECT_BIT;
      case VK_PIPELINE_STAGE_VERTEX_INPUT_BIT:
        return PIPELINESTAGE_VERTEX_INPUT_BIT;
      case VK_PIPELINE_STAGE_VERTEX_SHADER_BIT:
        return PIPELINESTAGE_VERTEX_SHADER_BIT;
      }
    }
    else if ((int)flags < 0x40) {
      if (flags == VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT) {
        return PIPELINESTAGE_TESSELLATION_CONTROL_SHADER_BIT;
      }
      if (flags == VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT) {
        return PIPELINESTAGE_TESSELLATION_EVALUATION_SHADER_BIT;
      }
    }
    else {
      if (flags == VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT) {
        return PIPELINESTAGE_GEOMETRY_SHADER_BIT;
      }
      if (flags == VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT) {
        return PIPELINESTAGE_FRAGMENT_SHADER_BIT;
      }
    }
  }
  else if ((int)flags < 0x800) {
    if (flags == VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT) {
      return PIPELINESTAGE_EARLY_FRAGMENT_TESTS_BIT;
    }
    if (flags == VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT) {
      return PIPELINESTAGE_LATE_FRAGMENT_TESTS_BIT;
    }
    if (flags == VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT) {
      return PIPELINESTAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
    }
  }
  else if ((int)flags < 0x2000) {
    if (flags == VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT) {
      return PIPELINESTAGE_COMPUTE_SHADER_BIT;
    }
    if (flags == VK_PIPELINE_STAGE_TRANSFER_BIT) {
      return PIPELINESTAGE_TRANSFER_BIT;
    }
  }
  else {
    if (flags == VK_PIPELINE_STAGE_HOST_BIT) {
      return PIPELINESTAGE_HOST_BIT;
    }
    if (flags == VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT) {
      return PIPELINESTAGE_BOTTOM_OF_PIPE_BIT;
    }
  }
  return PIPELINESTAGE_LAST;
}

Assistant:

PipelineStage pipelineStageFlagToPipelineStage (vk::VkPipelineStageFlagBits flags)
{
	switch (flags)
	{
		case vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT:						return PIPELINESTAGE_TOP_OF_PIPE_BIT;
		case vk::VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT:					return PIPELINESTAGE_BOTTOM_OF_PIPE_BIT;
		case vk::VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT:					return PIPELINESTAGE_DRAW_INDIRECT_BIT;
		case vk::VK_PIPELINE_STAGE_VERTEX_INPUT_BIT:					return PIPELINESTAGE_VERTEX_INPUT_BIT;
		case vk::VK_PIPELINE_STAGE_VERTEX_SHADER_BIT:					return PIPELINESTAGE_VERTEX_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT:		return PIPELINESTAGE_TESSELLATION_CONTROL_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT:	return PIPELINESTAGE_TESSELLATION_EVALUATION_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT:					return PIPELINESTAGE_GEOMETRY_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT:					return PIPELINESTAGE_FRAGMENT_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT:			return PIPELINESTAGE_EARLY_FRAGMENT_TESTS_BIT;
		case vk::VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT:				return PIPELINESTAGE_LATE_FRAGMENT_TESTS_BIT;
		case vk::VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT:			return PIPELINESTAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
		case vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT:					return PIPELINESTAGE_COMPUTE_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_TRANSFER_BIT:						return PIPELINESTAGE_TRANSFER_BIT;
		case vk::VK_PIPELINE_STAGE_HOST_BIT:							return PIPELINESTAGE_HOST_BIT;

		default:
			DE_FATAL("Unknown pipeline stage flags");
			return PIPELINESTAGE_LAST;
	}
}